

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::calculateProblemRanges(SPxSolverBase<double> *this)

{
  int iVar1;
  double *pdVar2;
  undefined8 *puVar3;
  long in_RDI;
  double a;
  SPxLPBase<double> *pSVar4;
  SPxLPBase<double> *pSVar5;
  double absrhs;
  double abslhs;
  int i;
  double absobj;
  double absupp;
  double abslow;
  int j;
  double maxside;
  double minside;
  double maxbound;
  double minbound;
  double maxobj;
  double minobj;
  SPxLPBase<double> *in_stack_ffffffffffffff08;
  SPxLPBase<double> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  SPxLPBase<double> *pSVar6;
  SPxLPBase<double> *in_stack_ffffffffffffff20;
  SPxLPBase<double> *local_d8;
  Real local_c0;
  Real local_b8;
  Real local_b0;
  Real local_a8;
  Real local_98;
  Real local_90;
  int local_5c;
  int local_3c;
  SPxLPBase<double> *local_38;
  SPxLPBase<double> *local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  pdVar2 = (double *)infinity();
  local_10 = *pdVar2;
  local_18 = 0.0;
  pdVar2 = (double *)infinity();
  local_20 = *pdVar2;
  local_28 = 0.0;
  puVar3 = (undefined8 *)infinity();
  local_30 = (SPxLPBase<double> *)*puVar3;
  local_38 = (SPxLPBase<double> *)0x0;
  for (local_3c = 0; iVar1 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27640c),
      local_3c < iVar1; local_3c = local_3c + 1) {
    pdVar2 = SPxLPBase<double>::lower
                       (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    local_98 = spxAbs<double>(*pdVar2);
    pdVar2 = SPxLPBase<double>::lower
                       (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    local_b0 = spxAbs<double>(*pdVar2);
    a = SPxLPBase<double>::obj
                  (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    local_c0 = spxAbs<double>(a);
    pdVar2 = (double *)infinity();
    if (local_98 < *pdVar2) {
      local_90 = local_98;
      if (local_20 < local_98) {
        local_90 = local_20;
      }
      local_20 = local_90;
      if (local_98 < local_28) {
        local_98 = local_28;
      }
      local_28 = local_98;
    }
    pdVar2 = (double *)infinity();
    if (local_b0 < *pdVar2) {
      local_a8 = local_b0;
      if (local_20 < local_b0) {
        local_a8 = local_20;
      }
      local_20 = local_a8;
      if (local_b0 < local_28) {
        local_b0 = local_28;
      }
      local_28 = local_b0;
    }
    local_b8 = local_c0;
    if (local_10 < local_c0) {
      local_b8 = local_10;
    }
    local_10 = local_b8;
    if (local_c0 < local_18) {
      local_c0 = local_18;
    }
    local_18 = local_c0;
  }
  for (local_5c = 0; iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2766af),
      local_5c < iVar1; local_5c = local_5c + 1) {
    pdVar2 = SPxLPBase<double>::lhs
                       (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    pSVar4 = (SPxLPBase<double> *)spxAbs<double>(*pdVar2);
    pdVar2 = SPxLPBase<double>::rhs
                       (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    pSVar5 = (SPxLPBase<double> *)spxAbs<double>(*pdVar2);
    pdVar2 = (double *)infinity();
    pSVar6 = local_38;
    if (*pdVar2 <= (double)pSVar4 && (double)pSVar4 != *pdVar2) {
      local_d8 = pSVar4;
      if ((double)local_30 < (double)pSVar4) {
        local_d8 = local_30;
      }
      local_30 = local_d8;
      pSVar6 = pSVar4;
      if ((double)pSVar4 < (double)local_38) {
        pSVar6 = local_38;
      }
    }
    local_38 = pSVar6;
    pSVar6 = pSVar5;
    pdVar2 = (double *)infinity();
    pSVar4 = local_38;
    if ((double)pSVar6 < *pdVar2) {
      in_stack_ffffffffffffff10 = pSVar5;
      if ((double)local_30 < (double)pSVar5) {
        in_stack_ffffffffffffff10 = local_30;
      }
      in_stack_ffffffffffffff08 = pSVar5;
      pSVar4 = pSVar5;
      local_30 = in_stack_ffffffffffffff10;
      if ((double)pSVar5 < (double)local_38) {
        in_stack_ffffffffffffff08 = local_38;
        pSVar4 = local_38;
      }
    }
    local_38 = pSVar4;
  }
  *(double *)(in_RDI + 0x7b8) = local_28 - local_20;
  *(double *)(in_RDI + 0x7c0) = (double)local_38 - (double)local_30;
  *(double *)(in_RDI + 0x7c8) = local_18 - local_10;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}